

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_filename.c
# Opt level: O0

wchar_t file_close(archive_conflict *a,void *client_data)

{
  write_file_data *mine;
  void *client_data_local;
  archive_conflict *a_local;
  
  if (client_data == (void *)0x0) {
    a_local._4_4_ = L'\xffffffe2';
  }
  else {
    if (-1 < *client_data) {
      close(*client_data);
    }
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

static int
file_close(struct archive *a, void *client_data)
{
	struct write_file_data	*mine = (struct write_file_data *)client_data;

	(void)a; /* UNUSED */

	if (mine == NULL)
		return (ARCHIVE_FATAL);

	if (mine->fd >= 0)
		close(mine->fd);

	return (ARCHIVE_OK);
}